

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void get_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                     TileBufferDec (*tile_buffers) [64],int start_tile,int end_tile)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  aom_internal_error_info *info;
  long lVar4;
  long lVar5;
  uchar *mem;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t *local_60;
  
  lVar3 = (long)(pbi->common).tiles.rows;
  if (0 < lVar3) {
    uVar1 = (pbi->common).tiles.cols;
    info = &pbi->error;
    local_60 = &(*tile_buffers)[0].size;
    lVar4 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar5 = 0;
        iVar6 = iVar7;
        do {
          if (iVar6 <= end_tile && start_tile <= iVar6) {
            if (data_end <= data) {
              aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,
                                 "Data ended before all tiles were read.");
            }
            if (end_tile == iVar6) {
              uVar8 = (long)data_end - (long)data;
            }
            else {
              iVar2 = pbi->tile_size_bytes;
              if ((ulong)((long)data_end - (long)data) <= (long)iVar2 - 1U) {
                aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,"Not enough data to read tile size")
                ;
              }
              switch(iVar2) {
              case 1:
                uVar8 = (ulong)(byte)*(uint *)data;
                break;
              case 2:
                uVar8 = (ulong)(ushort)*(uint *)data;
                break;
              case 3:
                uVar8 = (ulong)(uint3)*(uint *)data;
                break;
              case 4:
                uVar8 = (ulong)*(uint *)data;
                break;
              default:
                uVar8 = 0xffffffffffffffff;
              }
              uVar8 = uVar8 + 1;
              data = (uint8_t *)((long)data + (long)iVar2);
              if ((ulong)((long)data_end - (long)data) < uVar8) {
                aom_internal_error(info,AOM_CODEC_CORRUPT_FRAME,
                                   "Truncated packet or corrupt tile size");
              }
            }
            *(uint8_t **)((long)local_60 + lVar5 + -8) = data;
            *(ulong *)((long)local_60 + lVar5) = uVar8;
            data = (uint8_t *)((long)data + uVar8);
          }
          iVar6 = iVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar5);
        iVar7 = iVar7 + uVar1;
      }
      lVar4 = lVar4 + 1;
      local_60 = local_60 + 0x80;
    } while (lVar4 != lVar3);
  }
  return;
}

Assistant:

static inline void get_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS], int start_tile,
    int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tc = 0;

  for (int r = 0; r < tile_rows; ++r) {
    for (int c = 0; c < tile_cols; ++c, ++tc) {
      TileBufferDec *const buf = &tile_buffers[r][c];

      const int is_last = (tc == end_tile);
      const size_t hdr_offset = 0;

      if (tc < start_tile || tc > end_tile) continue;

      if (data + hdr_offset >= data_end)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Data ended before all tiles were read.");
      data += hdr_offset;
      get_tile_buffer(data_end, pbi->tile_size_bytes, is_last, &pbi->error,
                      &data, buf);
    }
  }
}